

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_tensor_layout.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateTensorTypeWithDimValuesNV
          (ValidationState_t *_,Instruction *inst,ExpectedNumValues expected,bool is_view)

{
  bool bVar1;
  spv_result_t sVar2;
  uint uVar3;
  uint id;
  uint32_t uVar4;
  Instruction *pIVar5;
  long lVar6;
  DiagnosticStream *pDVar7;
  undefined7 in_register_00000009;
  char *pcVar8;
  spv_result_t sVar9;
  int iVar10;
  size_t index;
  uint64_t dim_value;
  string type_str;
  char *local_258;
  string local_250;
  char *local_230;
  char *local_228;
  char *local_220;
  char local_218;
  undefined7 uStack_217;
  DiagnosticStream local_208;
  
  local_228 = &local_218;
  local_220 = (char *)0x0;
  local_218 = '\0';
  if ((int)CONCAT71(in_register_00000009,is_view) == 0) {
    sVar2 = ValidateTensorLayoutResultTypeNV(_,inst);
    if (sVar2 != SPV_SUCCESS) goto LAB_001a3e59;
    pcVar8 = "TensorLayout";
    sVar9 = sVar2;
  }
  else {
    sVar2 = ValidateTensorViewResultTypeNV(_,inst);
    if (sVar2 != SPV_SUCCESS) goto LAB_001a3e59;
    pcVar8 = "TensorView";
    sVar9 = sVar2;
  }
  std::__cxx11::string::_M_replace((ulong)&local_228,0,local_220,(ulong)pcVar8);
  uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,0);
  id = Instruction::GetOperandAs<unsigned_int>(inst,2);
  pIVar5 = ValidationState_t::FindDef(_,id);
  if ((pIVar5 == (Instruction *)0x0) || (uVar3 != (pIVar5->inst_).type_id)) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    local_258 = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar7 = DiagnosticStream::operator<<(&local_208,&local_258);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," Result Type <id> ",0x12);
    ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," does not match ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7,local_228,(long)local_220);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," type.",6);
    sVar2 = pDVar7->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  else {
    lVar6 = (long)(inst->operands_).
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(inst->operands_).
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4;
    pIVar5 = ValidationState_t::FindDef(_,uVar3);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(pIVar5,1);
    bVar1 = ValidationState_t::EvalConstantValUint64(_,uVar3,(uint64_t *)&local_258);
    if (bVar1) {
      sVar2 = (*(code *)(&DAT_00378b58 + *(int *)(&DAT_00378b58 + (ulong)expected * 4)))();
      return sVar2;
    }
    sVar2 = SPV_SUCCESS;
    if (lVar6 != 3) {
      index = 3;
      sVar2 = sVar9;
      do {
        iVar10 = (int)index;
        uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,index);
        pIVar5 = ValidationState_t::FindDef(_,uVar3);
        if ((pIVar5 == (Instruction *)0x0) ||
           (bVar1 = ValidationState_t::IsIntScalarType(_,(pIVar5->inst_).type_id), !bVar1)) {
LAB_001a3d8c:
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          local_230 = spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar7 = DiagnosticStream::operator<<(&local_208,&local_230);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7," operand <id> ",0xe)
          ;
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar7," is not a 32-bit integer.",0x19);
          sVar2 = pDVar7->error_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream(&local_208);
          bVar1 = false;
        }
        else {
          uVar4 = ValidationState_t::GetBitWidth(_,(pIVar5->inst_).type_id);
          bVar1 = true;
          if (uVar4 != 0x20) goto LAB_001a3d8c;
        }
        if (!bVar1) goto LAB_001a3e59;
        index = (size_t)(iVar10 + 1);
      } while ((ulong)(iVar10 - 2) < lVar6 - 3U);
      sVar2 = SPV_SUCCESS;
    }
  }
LAB_001a3e59:
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateTensorTypeWithDimValuesNV(ValidationState_t& _,
                                               const Instruction* inst,
                                               ExpectedNumValues expected,
                                               bool is_view) {
  std::string type_str;
  if (is_view) {
    if (auto error = ValidateTensorViewResultTypeNV(_, inst)) return error;
    type_str = "TensorView";
  } else {
    if (auto error = ValidateTensorLayoutResultTypeNV(_, inst)) return error;
    type_str = "TensorLayout";
  }

  const auto result_type_id = inst->GetOperandAs<uint32_t>(0);
  const auto tensor_id = inst->GetOperandAs<uint32_t>(2);
  const auto tensor = _.FindDef(tensor_id);
  if (!tensor || result_type_id != tensor->type_id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Result Type <id> "
           << _.getIdName(result_type_id) << " does not match " << type_str
           << " type.";
  }

  const auto num_values = inst->operands().size() - 3;

  const auto result_type = _.FindDef(result_type_id);
  const auto dim_index = 1;
  const auto dim_id = result_type->GetOperandAs<uint32_t>(dim_index);
  uint64_t dim_value;
  if (_.EvalConstantValUint64(dim_id, &dim_value)) {
    uint64_t expected_num_values = 0;
    switch (expected) {
      case DIM:
        expected_num_values = dim_value;
        break;
      case DIMx2:
        expected_num_values = dim_value * 2;
        break;
      case ONE:
        expected_num_values = 1;
        break;
      case FOUR:
        expected_num_values = 4;
        break;
    }

    if (num_values != expected_num_values) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode())
             << " unexpected number of operands.";
    }
  }

  for (uint32_t i = 0; i < num_values; ++i) {
    const auto val_id = inst->GetOperandAs<uint32_t>(i + 3);
    const auto val = _.FindDef(val_id);
    if (!val || !_.IsIntScalarType(val->type_id()) ||
        _.GetBitWidth(val->type_id()) != 32) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " operand <id> "
             << _.getIdName(val_id) << " is not a 32-bit integer.";
    }
  }

  return SPV_SUCCESS;
}